

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O1

size_t count_monsters(MyGame_Example_Monster_vec_t monsters,char *name)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  long lVar4;
  size_t i__tmp;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  
  lVar6 = 4;
  uVar5 = 0;
  while( true ) {
    if (monsters == (MyGame_Example_Monster_vec_t)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)monsters[-1];
    }
    if (uVar2 <= uVar5) break;
    if (monsters == (MyGame_Example_Monster_vec_t)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)monsters[-1];
    }
    if (uVar2 <= uVar5) {
LAB_001095a3:
      __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                    ,0x43a,
                    "MyGame_Example_Monster_table_t MyGame_Example_Monster_vec_at(MyGame_Example_Monster_vec_t, size_t)"
                   );
    }
    uVar2 = (ulong)monsters[uVar5];
    lVar4 = uVar2 - (long)*(int *)((long)monsters + uVar2 + uVar5 * 4);
    if (*(ushort *)((long)monsters + lVar4 + uVar5 * 4) < 0xc) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)((long)monsters + uVar5 * 4 + lVar4 + 10);
    }
    if (uVar3 == 0) {
LAB_00109584:
      __assert_fail("!(1) && \"required field missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                    ,0x440,
                    "flatbuffers_string_t MyGame_Example_Monster_name_get(MyGame_Example_Monster_table_t)"
                   );
    }
    iVar1 = strcmp((char *)((long)monsters +
                           (ulong)*(uint *)((long)monsters + uVar5 * 4 + uVar3 + uVar2) +
                           uVar3 + uVar2 + lVar6),name);
    if (iVar1 == 0) goto LAB_001094cb;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 4;
  }
  uVar5 = 0xffffffffffffffff;
LAB_001094cb:
  sVar7 = 0;
  do {
    if (uVar5 == 0xffffffffffffffff) {
      return sVar7;
    }
    sVar7 = sVar7 + 1;
    lVar6 = uVar5 * 4 + 8;
    do {
      uVar5 = uVar5 + 1;
      if (monsters == (MyGame_Example_Monster_vec_t)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (ulong)monsters[-1];
      }
      if (uVar2 <= uVar5) {
        uVar5 = 0xffffffffffffffff;
        break;
      }
      if (monsters == (MyGame_Example_Monster_vec_t)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (ulong)monsters[-1];
      }
      if (uVar2 <= uVar5) goto LAB_001095a3;
      uVar2 = (ulong)monsters[uVar5];
      lVar4 = uVar2 - (long)*(int *)((long)monsters + uVar2 + uVar5 * 4);
      if (*(ushort *)((long)monsters + lVar4 + uVar5 * 4) < 0xc) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)((long)monsters + uVar5 * 4 + lVar4 + 10);
      }
      if (uVar3 == 0) goto LAB_00109584;
      iVar1 = strcmp((char *)((long)monsters +
                             (ulong)*(uint *)((long)monsters + uVar5 * 4 + uVar3 + uVar2) +
                             uVar3 + uVar2 + lVar6),name);
      lVar6 = lVar6 + 4;
    } while (iVar1 != 0);
  } while( true );
}

Assistant:

static size_t count_monsters(ns(Monster_vec_t) monsters, const char *name)
{
    size_t i;
    size_t count = 0;

    for (i = ns(Monster_vec_scan)(monsters, name);
         i != nsc(not_found);
         i = ns(Monster_vec_scan_ex)(monsters, i + 1, nsc(end), name)) {
        ++count;
    }

    return count;
}